

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace-type-impl.cpp
# Opt level: O2

void __thiscall
yactfr::internal::SetKeyDtsDtVisitor::_setKeyDtsVar<yactfr::VariantWithUnsignedIntegerSelectorType>
          (SetKeyDtsDtVisitor *this,VariantWithUnsignedIntegerSelectorType *dt,DataLocation *loc,
          const_iterator locIt,DataTypeSet *dts)

{
  pointer puVar1;
  const_iterator cVar2;
  unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>
  *opt;
  pointer puVar3;
  key_type local_38;
  
  local_38 = (key_type)dt;
  cVar2 = std::
          _Hashtable<const_yactfr::DataType_*,_std::pair<const_yactfr::DataType_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::DataType_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::DataType_*>,_std::hash<const_yactfr::DataType_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->_current)._M_h,&local_38);
  if (cVar2.
      super__Node_iterator_base<std::pair<const_yactfr::DataType_*const,_unsigned_long_long>,_false>
      ._M_cur == (__node_type *)0x0) {
    puVar1 = (dt->super_VariantWithIntegerSelectorType<unsigned_long_long>)._opts.
             super__Vector_base<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar3 = (dt->super_VariantWithIntegerSelectorType<unsigned_long_long>)._opts.
                  super__Vector_base<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1)
    {
      _setKeyDts(this,(DataType *)
                      (((puVar3->_M_t).
                        super___uniq_ptr_impl<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_const_yactfr::VariantTypeOption<unsigned_long_long>_*,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>
                        .
                        super__Head_base<0UL,_const_yactfr::VariantTypeOption<unsigned_long_long>_*,_false>
                       ._M_head_impl)->_dt)._M_t.
                      super___uniq_ptr_impl<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_>
                 ,loc,locIt,dts);
    }
  }
  else {
    _setKeyDts(this,*(DataType **)
                     ((long)(dt->super_VariantWithIntegerSelectorType<unsigned_long_long>)._opts.
                            super__Vector_base<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start
                            [*(long *)((long)cVar2.
                                             super__Node_iterator_base<std::pair<const_yactfr::DataType_*const,_unsigned_long_long>,_false>
                                             ._M_cur + 0x10)]._M_t.
                            super___uniq_ptr_impl<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>
                            ._M_t + 0x50),loc,locIt,dts);
  }
  return;
}

Assistant:

void _setKeyDtsVar(const VarTypeT& dt, const DataLocation& loc,
                       const DataLocation::PathElements::const_iterator locIt, DataTypeSet& dts) const
    {
        const auto it = _current.find(&dt);

        if (it == _current.end()) {
            // fan out (consider all options)
            for (auto& opt : dt.options()) {
                this->_setKeyDts(opt->dataType(), loc, locIt, dts);
            }
        } else {
            // follow current option only
            this->_setKeyDts(dt[it->second].dataType(), loc, locIt, dts);
        }
    }